

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpack.cxx
# Opt level: O1

int cpackDefinitionArgument(char *argument,char *cValue,void *call_data)

{
  cmCPackLog *pcVar1;
  _Alloc_hider msg;
  char *pcVar2;
  long *msg_00;
  long lVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  size_t sVar6;
  int iVar7;
  char *__s;
  string key;
  string value;
  ostringstream cmCPackLog_msg;
  key_type local_1f8;
  long *local_1d8;
  char *local_1d0;
  long local_1c8 [2];
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::string::string((string *)&local_1d8,cValue,(allocator *)local_198);
  lVar3 = std::__cxx11::string::find_first_of((char *)&local_1d8,0x52d09e,0);
  if (lVar3 == -1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Please specify CPack definitions as: KEY=VALUE",0x2e);
    std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
    std::ostream::put((char)local_198);
    std::ostream::flush();
    pcVar1 = *(cmCPackLog **)((long)call_data + 0x30);
    std::__cxx11::stringbuf::str();
    msg._M_p = local_1f8._M_dataplus._M_p;
    sVar6 = strlen(local_1f8._M_dataplus._M_p);
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x56,msg._M_p,sVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    iVar7 = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&local_1d8);
    pcVar2 = local_1d0;
    __s = (char *)((long)local_1d8 + lVar3 + 1);
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_1d8,0,pcVar2,(ulong)__s);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)call_data,&local_1f8);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Set CPack variable: ",0x14);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," to \"",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)local_1d8,(long)local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    pcVar1 = *(cmCPackLog **)((long)call_data + 0x30);
    std::__cxx11::stringbuf::str();
    msg_00 = local_1b8;
    sVar6 = strlen((char *)local_1b8);
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cpack.cxx"
                    ,0x5d,(char *)msg_00,sVar6);
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8,local_1a8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    iVar7 = 1;
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  return iVar7;
}

Assistant:

int cpackDefinitionArgument(const char* argument, const char* cValue,
  void* call_data)
{
  (void)argument;
  cpackDefinitions* def = static_cast<cpackDefinitions*>(call_data);
  std::string value = cValue;
  size_t pos = value.find_first_of("=");
  if ( pos == std::string::npos )
    {
    cmCPack_Log(def->Log, cmCPackLog::LOG_ERROR,
      "Please specify CPack definitions as: KEY=VALUE" << std::endl);
    return 0;
    }
  std::string key = value.substr(0, pos);
  value = value.c_str() + pos + 1;
  def->Map[key] = value;
  cmCPack_Log(def->Log, cmCPackLog::LOG_DEBUG, "Set CPack variable: "
    << key << " to \"" << value << "\"" << std::endl);
  return 1;
}